

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O0

void __thiscall
gpu::BlendFilters<unsigned_char>::apply
          (BlendFilters<unsigned_char> *this,uchar *pixelBaseR,uchar *pixelBaseG,uchar *pixelBaseB,
          uchar *pixelBlendR,uchar *pixelBlendG,uchar *pixelBlendB,uchar *pixelDestinationR,
          uchar *pixelDestinationG,uchar *pixelDestinationB,float alpha,BlendType blendType)

{
  uchar *in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  BlendFilters<unsigned_char> *in_RDI;
  uchar *in_R8;
  uchar *in_R9;
  float in_XMM0_Da;
  uchar *in_stack_00000008;
  undefined4 in_stack_00000010;
  
  switch((ulong)pixelBaseB & 0xffffffff) {
  case 0:
    normal(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    normal(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    normal(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 1:
    lighten(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    lighten(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    lighten(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 2:
    darken(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    darken(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    darken(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 3:
    multiply(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    multiply(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    multiply(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 4:
    average(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    average(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    average(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 5:
    add(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    add(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    add(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 6:
    subtract(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    subtract(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    subtract(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 7:
    difference(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    difference(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    difference(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 8:
    negation(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    negation(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    negation(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 9:
    screen(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    screen(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    screen(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 10:
    exclusion(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    exclusion(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    exclusion(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0xb:
    overlay(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    overlay(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    overlay(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0xc:
    softLight(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    softLight(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    softLight(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0xd:
    hardLight(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    hardLight(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    hardLight(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0xe:
    colorDodge(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    colorDodge(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    colorDodge(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0xf:
    colorBurn(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    colorBurn(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    colorBurn(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x10:
    normal(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    normal(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    normal(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x11:
    linearBurn(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    linearBurn(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    linearBurn(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x12:
    linearLight(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    linearLight(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    linearLight(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x13:
    vividLight(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    vividLight(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    vividLight(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x14:
    pinLight(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    pinLight(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    pinLight(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
    break;
  case 0x15:
    hardMix(in_RDI,in_RSI,in_R8,(uchar *)CONCAT44(alpha,in_stack_00000010),in_XMM0_Da);
    hardMix(in_RDI,in_RDX,in_R9,pixelBlendG,in_XMM0_Da);
    hardMix(in_RDI,in_RCX,in_stack_00000008,pixelBlendR,in_XMM0_Da);
  }
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::apply(T& pixelBaseR, 
                                                T& pixelBaseG,
                                                T& pixelBaseB,
                                                T& pixelBlendR, 
                                                T& pixelBlendG,
                                                T& pixelBlendB, 
                                                T& pixelDestinationR, 
                                                T& pixelDestinationG,
                                                T& pixelDestinationB,
                                                float alpha,
                                                BlendType blendType)
    {
      switch(blendType)
      {
      case BLEND_FILTER_NORMAL:      
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LIGHTEN:       
        lighten(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        lighten(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        lighten(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DARKEN:       
        darken(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        darken(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        darken(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_MULTIPLY:     
        multiply(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        multiply(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        multiply(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_AVERAGE:      
        average(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        average(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        average(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_ADD:        
        add(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        add(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        add(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SUBTRACT:    
        subtract(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        subtract(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        subtract(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DIFFERENCE:   
        difference(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        difference(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        difference(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_NEGATION:     
        negation(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        negation(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        negation(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SCREEN:       
        screen(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        screen(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        screen(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_EXCLUSION:   
        exclusion(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        exclusion(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        exclusion(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;   

      case BLEND_FILTER_OVERLAY:      
        overlay(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        overlay(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        overlay(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SOFTLIGHT:   
        softLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        softLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        softLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;  

      case BLEND_FILTER_HARDLIGHT:    
        hardLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORDODGE:    
        colorDodge(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorDodge(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorDodge(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORBURN:     
        colorBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARDODGE:   
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARBURN:    
        linearBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARLIGHT: 
        linearLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_VIVIDLIGHT:   

        vividLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        vividLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        vividLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_PINLIGHT:     
        pinLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        pinLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        pinLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_HARDMIX:     
        hardMix(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardMix(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardMix(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      }
    }